

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  ulong uVar1;
  size_type sVar2;
  reference ppTVar3;
  __normal_iterator<testing::TestEventListener_**,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  local_40;
  __normal_iterator<testing::TestEventListener_**,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
  local_38;
  const_iterator local_30;
  ulong local_28;
  size_t i;
  TestEventListener *listener_local;
  TestEventRepeater *this_local;
  
  local_28 = 0;
  i = (size_t)listener;
  listener_local = &this->super_TestEventListener;
  while( true ) {
    uVar1 = local_28;
    sVar2 = std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ::size(&this->listeners_);
    if (sVar2 <= uVar1) {
      return (TestEventListener *)0x0;
    }
    ppTVar3 = std::
              vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::
              operator[](&this->listeners_,local_28);
    if (*ppTVar3 == (value_type)i) break;
    local_28 = local_28 + 1;
  }
  local_40._M_current =
       (TestEventListener **)
       std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::
       begin(&this->listeners_);
  local_38 = __gnu_cxx::
             __normal_iterator<testing::TestEventListener_**,_std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>_>
             ::operator+(&local_40,local_28);
  __gnu_cxx::
  __normal_iterator<testing::TestEventListener*const*,std::vector<testing::TestEventListener*,std::allocator<testing::TestEventListener*>>>
  ::__normal_iterator<testing::TestEventListener**>
            ((__normal_iterator<testing::TestEventListener*const*,std::vector<testing::TestEventListener*,std::allocator<testing::TestEventListener*>>>
              *)&local_30,&local_38);
  std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::erase
            (&this->listeners_,local_30);
  return (TestEventListener *)i;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener *listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + i);
      return listener;
    }
  }

  return NULL;
}